

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcSpace::IfcSpace(IfcSpace *this)

{
  IfcSpace *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x198,"IfcSpace");
  IfcSpatialStructureElement::IfcSpatialStructureElement
            (&this->super_IfcSpatialStructureElement,&PTR_construction_vtable_24__00f92bc8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpace,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpace,_2UL> *)
             &(this->super_IfcSpatialStructureElement).field_0x158,
             &PTR_construction_vtable_24__00f92cb8);
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject =
       0xf92ac0;
  *(undefined8 *)&this->field_0x198 = 0xf92bb0;
  *(undefined8 *)
   &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x88 = 0xf92ae8;
  (this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xf92b10;
  *(undefined8 *)
   &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0xf92b38;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.field_0x100 = 0xf92b60;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).field_0x158 = 0xf92b88;
  std::__cxx11::string::string((string *)&(this->super_IfcSpatialStructureElement).field_0x168);
  STEP::Maybe<double>::Maybe(&this->ElevationWithFlooring);
  return;
}

Assistant:

IfcSpace() : Object("IfcSpace") {}